

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int fftkyn(fitsfile *fptr,int numkey,char *name,char *value,int *status)

{
  int iVar1;
  char valuestring [71];
  char keyname [75];
  char comm [73];
  char message [81];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [96];
  
  if (0 < *status) {
    return *status;
  }
  local_128[0] = '\0';
  local_178[0] = '\0';
  iVar1 = ffgkyn(fptr,numkey,local_128,local_178,local_d8,status);
  if (iVar1 < 1) {
    iVar1 = strcmp(local_128,name);
    if (iVar1 != 0) {
      *status = 0xd0;
    }
    iVar1 = strcmp(value,local_178);
    if (iVar1 != 0) {
      *status = 0xd1;
      goto LAB_001b5efc;
    }
  }
  if (*status < 1) {
    return *status;
  }
LAB_001b5efc:
  snprintf(local_88,0x51,"fftkyn found unexpected keyword or value for keyword no. %d.",numkey);
  ffpmsg(local_88);
  snprintf(local_88,0x51," Expected keyword %s with value %s, but",name,value);
  ffpmsg(local_88);
  snprintf(local_88,0x51," found keyword %s with value %s",local_128,local_178);
  ffpmsg(local_88);
  return *status;
}

Assistant:

int fftkyn(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           char *value,     /* I - expected value of the keyword  */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and the
  expected value string.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        if (strcmp(value, valuestring) )
            *status = NOT_POS_INT;  /* incorrect keyword value */
    }

    if (*status > 0)
    {
        snprintf(message, FLEN_ERRMSG,
          "fftkyn found unexpected keyword or value for keyword no. %d.",
          numkey);
        ffpmsg(message);

        snprintf(message, FLEN_ERRMSG,
          " Expected keyword %s with value %s, but", name, value);
        ffpmsg(message);

        snprintf(message, FLEN_ERRMSG,
          " found keyword %s with value %s", keyname, valuestring);
        ffpmsg(message);
    }

    return(*status);
}